

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O0

void pzshape::TPZShapeDisc::Shape2D
               (REAL C,TPZVec<double> *X0,TPZVec<double> *X,int degree,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi,MShapeType type)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  long *in_RCX;
  int in_EDX;
  TPZVec<double> *in_RSI;
  TPZVec<double> *in_RDI;
  long *in_R8;
  int in_R9D;
  undefined8 in_XMM0_Qa;
  REAL dphi0 [2];
  REAL phi0;
  int nshape;
  int num;
  int counter;
  int iy;
  int ix;
  int j;
  int i;
  TPZFNMatrix<660,_double> dphiy;
  TPZFNMatrix<660,_double> dphix;
  TPZFNMatrix<660,_double> phiy;
  TPZFNMatrix<660,_double> phix;
  REAL y;
  REAL x;
  REAL y0;
  REAL x0;
  undefined8 in_stack_ffffffffffffa7f8;
  TPZFNMatrix<660,_double> *in_stack_ffffffffffffa800;
  double dVar6;
  int64_t in_stack_ffffffffffffa808;
  TPZFMatrix<double> *in_stack_ffffffffffffa810;
  TPZFMatrix<double> *this;
  int local_555c;
  int local_5550;
  int local_554c;
  undefined1 local_5548 [5432];
  undefined1 local_4010 [5448];
  undefined1 local_2ac8 [5432];
  undefined1 local_1590 [5432];
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  int local_34;
  long *local_30;
  long *local_28;
  int local_1c;
  TPZVec<double> *local_18;
  TPZVec<double> *local_10;
  undefined8 local_8;
  
  if (in_EDX == 0) {
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                        (int64_t)in_stack_ffffffffffffa800);
    *pdVar5 = 1.0;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                        (int64_t)in_stack_ffffffffffffa800);
    *pdVar5 = 0.0;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                        (int64_t)in_stack_ffffffffffffa800);
    *pdVar5 = 0.0;
  }
  else {
    local_34 = in_R9D;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_8 = in_XMM0_Qa;
    pdVar5 = TPZVec<double>::operator[](in_RDI,0);
    local_40 = *pdVar5;
    pdVar5 = TPZVec<double>::operator[](local_10,1);
    local_48 = *pdVar5;
    pdVar5 = TPZVec<double>::operator[](local_18,0);
    local_50 = *pdVar5;
    pdVar5 = TPZVec<double>::operator[](local_18,1);
    local_58 = *pdVar5;
    TPZFNMatrix<660,_double>::TPZFNMatrix(in_stack_ffffffffffffa800);
    TPZFNMatrix<660,_double>::TPZFNMatrix(in_stack_ffffffffffffa800);
    TPZFNMatrix<660,_double>::TPZFNMatrix(in_stack_ffffffffffffa800);
    TPZFNMatrix<660,_double>::TPZFNMatrix(in_stack_ffffffffffffa800);
    (*(code *)fOrthogonal)(local_8,local_40,local_50,local_1c,local_1590,local_4010,1);
    (*(code *)fOrthogonal)(local_8,local_48,local_58,local_1c,local_2ac8,local_5548,1);
    local_555c = 0;
    iVar3 = local_1c + 1;
    iVar4 = NShapeF((int)in_stack_ffffffffffffa800,(int)((ulong)in_stack_ffffffffffffa7f8 >> 0x20),
                    (MShapeType)in_stack_ffffffffffffa7f8);
    (**(code **)(*local_28 + 0x70))(local_28,(long)iVar4,1);
    (**(code **)(*local_30 + 0x70))(local_30,2,(long)iVar4);
    (**(code **)(*local_28 + 0x78))();
    (**(code **)(*local_30 + 0x78))();
    if (local_34 == 1) {
      for (local_554c = 0; local_554c <= local_1c; local_554c = local_554c + 1) {
        for (local_5550 = 0; local_5550 <= local_554c; local_5550 = local_5550 + 1) {
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          dVar6 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          dVar1 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          *pdVar5 = dVar6 * dVar1;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          dVar6 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          dVar1 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          *pdVar5 = dVar6 * dVar1;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          dVar6 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          dVar1 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          *pdVar5 = dVar6 * dVar1;
          local_555c = local_555c + 1;
        }
      }
    }
    else {
      for (local_554c = 0; local_554c < iVar3; local_554c = local_554c + 1) {
        for (local_5550 = 0; local_5550 < local_554c; local_5550 = local_5550 + 1) {
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          dVar6 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          dVar1 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          *pdVar5 = dVar6 * dVar1;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          dVar6 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          dVar1 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          *pdVar5 = dVar6 * dVar1;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          dVar6 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          dVar1 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          *pdVar5 = dVar6 * dVar1;
          local_555c = local_555c + 1;
        }
        for (local_5550 = 0; local_5550 < local_554c; local_5550 = local_5550 + 1) {
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          dVar6 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          dVar1 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          *pdVar5 = dVar6 * dVar1;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          dVar6 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          dVar1 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          *pdVar5 = dVar6 * dVar1;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          dVar6 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          dVar1 = *pdVar5;
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                              (int64_t)in_stack_ffffffffffffa800);
          *pdVar5 = dVar6 * dVar1;
          local_555c = local_555c + 1;
        }
        pdVar5 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                            (int64_t)in_stack_ffffffffffffa800);
        dVar6 = *pdVar5;
        pdVar5 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                            (int64_t)in_stack_ffffffffffffa800);
        dVar1 = *pdVar5;
        pdVar5 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                            (int64_t)in_stack_ffffffffffffa800);
        *pdVar5 = dVar6 * dVar1;
        pdVar5 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                            (int64_t)in_stack_ffffffffffffa800);
        dVar6 = *pdVar5;
        pdVar5 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                            (int64_t)in_stack_ffffffffffffa800);
        dVar1 = *pdVar5;
        pdVar5 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                            (int64_t)in_stack_ffffffffffffa800);
        *pdVar5 = dVar6 * dVar1;
        pdVar5 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                            (int64_t)in_stack_ffffffffffffa800);
        dVar6 = *pdVar5;
        pdVar5 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                            (int64_t)in_stack_ffffffffffffa800);
        dVar1 = *pdVar5;
        pdVar5 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                            (int64_t)in_stack_ffffffffffffa800);
        *pdVar5 = dVar6 * dVar1;
        local_555c = local_555c + 1;
      }
    }
    if (local_555c != iVar4) {
      std::operator<<((ostream *)&std::cerr,"TPZShapeDisc::Shape2D wrong shape count\n");
    }
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                        (int64_t)in_stack_ffffffffffffa800);
    this = (TPZFMatrix<double> *)*pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                        (int64_t)in_stack_ffffffffffffa800);
    dVar6 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                        (int64_t)in_stack_ffffffffffffa800);
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                        (int64_t)in_stack_ffffffffffffa800);
    dVar2 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                        (int64_t)in_stack_ffffffffffffa800);
    *pdVar5 = dVar2;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                        (int64_t)in_stack_ffffffffffffa800);
    dVar2 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                        (int64_t)in_stack_ffffffffffffa800);
    *pdVar5 = dVar2;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                        (int64_t)in_stack_ffffffffffffa800);
    dVar2 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffa810,in_stack_ffffffffffffa808,
                        (int64_t)in_stack_ffffffffffffa800);
    *pdVar5 = dVar2;
    pdVar5 = TPZFMatrix<double>::operator()
                       (this,in_stack_ffffffffffffa808,(int64_t)in_stack_ffffffffffffa800);
    *pdVar5 = (double)this;
    pdVar5 = TPZFMatrix<double>::operator()(this,in_stack_ffffffffffffa808,(int64_t)dVar6);
    *pdVar5 = dVar6;
    pdVar5 = TPZFMatrix<double>::operator()(this,(int64_t)pdVar5,(int64_t)dVar6);
    *pdVar5 = dVar1;
    TPZFNMatrix<660,_double>::~TPZFNMatrix((TPZFNMatrix<660,_double> *)0x1869b69);
    TPZFNMatrix<660,_double>::~TPZFNMatrix((TPZFNMatrix<660,_double> *)0x1869b76);
    TPZFNMatrix<660,_double>::~TPZFNMatrix((TPZFNMatrix<660,_double> *)0x1869b83);
    TPZFNMatrix<660,_double>::~TPZFNMatrix((TPZFNMatrix<660,_double> *)0x1869b90);
  }
  return;
}

Assistant:

void TPZShapeDisc::Shape2D(REAL C,TPZVec<REAL> &X0,TPZVec<REAL> &X,int degree,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi, MShapeType type){

  if(degree == 0) {
    phi(0,0) = 1.;
    dphi(0,0) = 0.;
    dphi(1,0) = 0.;
    return;
  }
  REAL x0 = X0[0];
  REAL y0 = X0[1];
  REAL x = X[0];
  REAL y = X[1];

  TPZFNMatrix<660> phix,phiy,dphix,dphiy;

  fOrthogonal(C,x0,x,degree,phix,dphix,1);
  fOrthogonal(C,y0,y,degree,phiy,dphiy,1);

  int i, j, ix, iy, counter=0, num = degree+1;

  int nshape = NShapeF(degree,2,type);
//  int count=num,ind=0;
  phi.Redim(nshape,1);
  dphi.Redim(2,nshape);
  phi.Zero();
  dphi.Zero();

  if(type==EOrdemTotal)
  {
  //mounts the shape function according to the max order:
  //  ____
  // |///
  // |//
  // |/

    for(i = 0; i <= degree; i++)
    {
       for(j = 0; j <= i; j++)
       {
          // notice that ix+iy is always constant for given i
          ix = j;
	  iy = i - j;
          phi(counter,0) = phix(ix,0)*phiy(iy,0);
          dphi(0,counter) = dphix(0,ix)*phiy(iy,0);
          dphi(1,counter) = phix(ix,0)*dphiy(0,iy);
          counter++;
       }
    }
  }else{
  // mounts the shape functions according to each
  // direction order
  // The functions are assembled in this sequence:
  // x functions, y functions, max xy
  // (horizontal, vertical lines and the 0 in the graph)
  // _____
  // |0|||
  // |-0||
  // |--0|
  // |---0
    // type == ETensorial
    for(i=0;i<num;i++)
    {
      for(j=0;j<i;j++)
      {
         ix = j;
	 iy = i;
         phi(counter,0) = phix(ix,0)*phiy(iy,0);
         dphi(0,counter) = dphix(0,ix)*phiy(iy,0);
         dphi(1,counter) = phix(ix,0)*dphiy(0,iy);
	 counter++;
      }
      for(j=0;j<i;j++)
      {
         ix = i;
	 iy = j;
         phi(counter,0) = phix(ix,0)*phiy(iy,0);
         dphi(0,counter) = dphix(0,ix)*phiy(iy,0);
         dphi(1,counter) = phix(ix,0)*dphiy(0,iy);
	 counter++;
      }

      ix = i;
      iy = i;
      phi(counter,0) = phix(ix,0)*phiy(iy,0);
      dphi(0,counter) = dphix(0,ix)*phiy(iy,0);
      dphi(1,counter) = phix(ix,0)*dphiy(0,iy);
      counter++;
    }
  }

  if(counter != nshape) {
    PZError << "TPZShapeDisc::Shape2D wrong shape count\n";
  }
  REAL phi0,dphi0[2];
  phi0 = phi(0,0);//here
  dphi0[0] = dphi(0,0);
  dphi0[1] = dphi(1,0);
  phi(0,0) = phi(nshape-1,0);//here
  dphi(0,0) = dphi(0,nshape-1);
  dphi(1,0) = dphi(1,nshape-1);

  phi(nshape-1,0) = phi0;//here
  dphi(0,nshape-1) = dphi0[0];
  dphi(1,nshape-1) = dphi0[1];
}